

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

bool bssl::anon_unknown_0::CacheEquals
               (SSL_CTX *ctx,vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *expected)

{
  pointer ppsVar1;
  long lVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  ssl_session_st *psVar6;
  ssl_session_st *psVar7;
  ulong uVar8;
  pointer ppsVar9;
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *__range2;
  bool bVar10;
  bool bVar11;
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> expected_copy;
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> actual;
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> local_68;
  void *local_48;
  void *pvStack_40;
  long local_38;
  code *local_28;
  void **local_20;
  
  psVar7 = ctx->session_cache_head;
  ppsVar9 = (expected->super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppsVar1 = (expected->super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  bVar10 = ppsVar9 == ppsVar1;
  if (!bVar10) {
    psVar6 = psVar7;
    do {
      psVar7 = psVar6;
      if ((psVar6 == *ppsVar9) &&
         (psVar7 = psVar6->next, psVar6->next == (ssl_session_st *)&ctx->session_cache_tail)) {
        psVar7 = (ssl_session_st *)0x0;
      }
      if (psVar6 != *ppsVar9) break;
      ppsVar9 = ppsVar9 + 1;
      bVar10 = ppsVar9 == ppsVar1;
      psVar6 = psVar7;
    } while (!bVar10);
  }
  bVar11 = false;
  if ((bVar10) && (bVar11 = false, psVar7 == (ssl_session_st *)0x0)) {
    local_20 = &local_48;
    local_48 = (void *)0x0;
    pvStack_40 = (void *)0x0;
    local_38 = 0;
    local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28 = AppendSession;
    OPENSSL_lh_doall_arg((_LHASH *)ctx->sessions,lh_SSL_SESSION_call_doall_arg,&local_28);
    std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::operator=(&local_68,expected);
    pvVar4 = pvStack_40;
    pvVar3 = local_48;
    if (local_48 != pvStack_40) {
      uVar8 = (long)pvStack_40 - (long)local_48 >> 3;
      lVar2 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<ssl_session_st**,std::vector<ssl_session_st*,std::allocator<ssl_session_st*>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_48,pvStack_40,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<ssl_session_st**,std::vector<ssl_session_st*,std::allocator<ssl_session_st*>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pvVar3,pvVar4);
    }
    ppsVar1 = local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppsVar9 = local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar8 = (long)local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
      lVar2 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<ssl_session_st**,std::vector<ssl_session_st*,std::allocator<ssl_session_st*>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<ssl_session_st**,std::vector<ssl_session_st*,std::allocator<ssl_session_st*>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (ppsVar9,ppsVar1);
    }
    ppsVar9 = local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((long)pvStack_40 - (long)local_48 ==
        (long)local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_68.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>.
              _M_impl.super__Vector_impl_data._M_start) {
      if (pvStack_40 == local_48) {
        bVar11 = true;
      }
      else {
        iVar5 = bcmp(local_48,local_68.
                              super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                     (long)pvStack_40 - (long)local_48);
        bVar11 = iVar5 == 0;
      }
    }
    else {
      bVar11 = false;
    }
    if (ppsVar9 != (pointer)0x0) {
      operator_delete(ppsVar9,(long)local_68.
                                    super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppsVar9);
    }
    if (local_48 != (void *)0x0) {
      operator_delete(local_48,local_38 - (long)local_48);
    }
  }
  return bVar11;
}

Assistant:

static bool CacheEquals(SSL_CTX *ctx,
                        const std::vector<SSL_SESSION *> &expected) {
  // Check the linked list.
  SSL_SESSION *ptr = ctx->session_cache_head;
  for (SSL_SESSION *session : expected) {
    if (ptr != session) {
      return false;
    }
    // TODO(davidben): This is an absurd way to denote the end of the list.
    if (ptr->next ==
        reinterpret_cast<SSL_SESSION *>(&ctx->session_cache_tail)) {
      ptr = nullptr;
    } else {
      ptr = ptr->next;
    }
  }
  if (ptr != nullptr) {
    return false;
  }

  // Check the hash table.
  std::vector<SSL_SESSION *> actual, expected_copy;
  lh_SSL_SESSION_doall_arg(ctx->sessions, AppendSession, &actual);
  expected_copy = expected;

  std::sort(actual.begin(), actual.end());
  std::sort(expected_copy.begin(), expected_copy.end());

  return actual == expected_copy;
}